

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O0

void Omega_h::add_implied_metric_tag(Mesh *mesh)

{
  void *mesh_00;
  allocator local_61;
  string local_60 [48];
  Read<double> local_30;
  undefined1 local_20 [8];
  Reals metrics;
  Mesh *mesh_local;
  
  metrics.write_.shared_alloc_.direct_ptr = mesh;
  get_implied_metrics((Omega_h *)local_20,mesh);
  mesh_00 = metrics.write_.shared_alloc_.direct_ptr;
  Read<double>::Read(&local_30,(Read<double> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"metric",&local_61);
  add_metric_tag((Mesh *)mesh_00,&local_30,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  Read<double>::~Read(&local_30);
  Read<double>::~Read((Read<double> *)local_20);
  return;
}

Assistant:

void add_implied_metric_tag(Mesh* mesh) {
  auto metrics = get_implied_metrics(mesh);
  add_metric_tag(mesh, metrics, "metric");
}